

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addMethod(QMetaObjectBuilder *this,QMetaMethod *prototype)

{
  undefined1 auVar1 [12];
  bool methodIsConst;
  MethodType MVar2;
  Access value;
  int iVar3;
  QMetaObjectBuilder *pQVar4;
  char *pcVar5;
  int iVar6;
  int __type;
  QArrayDataPointer<QByteArray> *__name;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar7;
  QArrayDataPointer<QByteArray> QStack_58;
  QMetaMethodBuilder local_40;
  long local_30;
  
  __name = &QStack_58;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._mobj = (QMetaObjectBuilder *)0x0;
  local_40._index = 0;
  local_40._12_4_ = 0xaaaaaaaa;
  MVar2 = QMetaMethod::methodType(prototype);
  if (MVar2 == Method) {
    QMetaMethod::methodSignature((QByteArray *)&QStack_58,prototype);
    QVar7 = addMethod(this,(QByteArray *)&QStack_58);
    auVar1 = QVar7._0_12_;
  }
  else {
    MVar2 = QMetaMethod::methodType(prototype);
    if (MVar2 == Signal) {
      QMetaMethod::methodSignature((QByteArray *)&QStack_58,prototype);
      QVar7 = addSignal(this,(QByteArray *)&QStack_58);
      auVar1 = QVar7._0_12_;
    }
    else {
      MVar2 = QMetaMethod::methodType(prototype);
      if (MVar2 == Slot) {
        QMetaMethod::methodSignature((QByteArray *)&QStack_58,prototype);
        QVar7 = addSlot(this,(QByteArray *)&QStack_58);
        auVar1 = QVar7._0_12_;
      }
      else {
        MVar2 = QMetaMethod::methodType(prototype);
        if (MVar2 != Constructor) {
          iVar6 = 0;
          pQVar4 = (QMetaObjectBuilder *)0x0;
          goto LAB_00267071;
        }
        QMetaMethod::methodSignature((QByteArray *)&QStack_58,prototype);
        QVar7 = addConstructor(this,(QByteArray *)&QStack_58);
        auVar1 = QVar7._0_12_;
      }
    }
  }
  pQVar4 = auVar1._0_8_;
  iVar6 = auVar1._8_4_;
  local_40._index = iVar6;
  local_40._mobj = pQVar4;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_58);
LAB_00267071:
  pcVar5 = QMetaMethod::typeName(prototype);
  QByteArray::QByteArray((QByteArray *)&QStack_58,pcVar5,-1);
  QMetaMethodBuilder::setReturnType(&local_40,(QByteArray *)&QStack_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_58);
  QMetaMethod::parameterNames((QList<QByteArray> *)&QStack_58,prototype);
  QMetaMethodBuilder::setParameterNames(&local_40,(QList<QByteArray> *)&QStack_58);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&QStack_58);
  pcVar5 = QMetaMethod::tag(prototype);
  QByteArray::QByteArray((QByteArray *)&QStack_58,pcVar5,-1);
  QMetaMethodBuilder::setTag(&local_40,(QByteArray *)&QStack_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_58);
  value = QMetaMethod::access(prototype,(char *)__name,__type);
  QMetaMethodBuilder::setAccess(&local_40,value);
  iVar3 = QMetaMethod::attributes(prototype);
  QMetaMethodBuilder::setAttributes(&local_40,iVar3);
  iVar3 = QMetaMethod::revision(prototype);
  QMetaMethodBuilder::setRevision(&local_40,iVar3);
  methodIsConst = QMetaMethod::isConst(prototype);
  QMetaMethodBuilder::setConst(&local_40,methodIsConst);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar7._index = iVar6;
    QVar7._mobj = pQVar4;
    QVar7._12_4_ = 0;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addMethod(const QMetaMethod &prototype)
{
    QMetaMethodBuilder method;
    if (prototype.methodType() == QMetaMethod::Method)
        method = addMethod(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Signal)
        method = addSignal(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Slot)
        method = addSlot(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Constructor)
        method = addConstructor(prototype.methodSignature());
    method.setReturnType(prototype.typeName());
    method.setParameterNames(prototype.parameterNames());
    method.setTag(prototype.tag());
    method.setAccess(prototype.access());
    method.setAttributes(prototype.attributes());
    method.setRevision(prototype.revision());
    method.setConst(prototype.isConst());
    return method;
}